

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::SourceCodeInfo_Location::MergeFrom
          (SourceCodeInfo_Location *this,SourceCodeInfo_Location *from)

{
  bool bVar1;
  LogMessage *other;
  string *psVar2;
  UnknownFieldSet *this_00;
  UnknownFieldSet *other_00;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  SourceCodeInfo_Location *local_18;
  SourceCodeInfo_Location *from_local;
  SourceCodeInfo_Location *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.pb.cc"
               ,0x1ece);
    local_51 = 1;
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(local_65,other);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  RepeatedField<int>::MergeFrom(&this->path_,&local_18->path_);
  RepeatedField<int>::MergeFrom(&this->span_,&local_18->span_);
  if ((local_18->_has_bits_[0] & 0x3fc) != 0) {
    bVar1 = has_leading_comments(local_18);
    if (bVar1) {
      psVar2 = leading_comments_abi_cxx11_(local_18);
      set_leading_comments(this,psVar2);
    }
    bVar1 = has_trailing_comments(local_18);
    if (bVar1) {
      psVar2 = trailing_comments_abi_cxx11_(local_18);
      set_trailing_comments(this,psVar2);
    }
  }
  this_00 = mutable_unknown_fields(this);
  other_00 = unknown_fields(local_18);
  UnknownFieldSet::MergeFrom(this_00,other_00);
  return;
}

Assistant:

void SourceCodeInfo_Location::MergeFrom(const SourceCodeInfo_Location& from) {
  GOOGLE_CHECK_NE(&from, this);
  path_.MergeFrom(from.path_);
  span_.MergeFrom(from.span_);
  if (from._has_bits_[2 / 32] & (0xffu << (2 % 32))) {
    if (from.has_leading_comments()) {
      set_leading_comments(from.leading_comments());
    }
    if (from.has_trailing_comments()) {
      set_trailing_comments(from.trailing_comments());
    }
  }
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}